

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinExport::WriteBinaryNode(AssbinExport *this,IOStream *container,aiNode *node)

{
  uint uVar1;
  uint i;
  uint uVar2;
  uint32_t t;
  AssbinChunkWriter chunk;
  AssbinChunkWriter local_98;
  float *local_60;
  uint local_54;
  aiNode *local_50;
  AssbinExport *local_48;
  float *local_40;
  float *local_38;
  
  local_98.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_0080c0c8;
  local_98.buffer = (uint8_t *)0x0;
  local_98.magic = 0x123c;
  local_98.cur_size = 0;
  local_98.cursor = 0;
  local_98.initial = 0x1000;
  if (node->mMetaData == (aiMetadata *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = node->mMetaData->mNumProperties;
  }
  uVar1 = (node->mName).length;
  local_98.container = container;
  local_48 = this;
  AssbinChunkWriter::Grow(&local_98,4);
  *(ai_uint32 *)(local_98.buffer + local_98.cursor) = (node->mName).length;
  local_98.cursor = local_98.cursor + 4;
  (*local_98.super_IOStream._vptr_IOStream[3])(&local_98,(node->mName).data,(ulong)uVar1,1);
  local_60 = &(node->mTransformation).d1;
  local_38 = &(node->mTransformation).c1;
  local_40 = &(node->mTransformation).b1;
  local_54 = uVar2;
  local_50 = node;
  (*local_98.super_IOStream._vptr_IOStream[3])(&local_98,&node->mTransformation,4,1);
  (*(code *)&LAB_00306e50)();
  return;
}

Assistant:

void WriteBinaryNode( IOStream * container, const aiNode* node)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AINODE );

        unsigned int nb_metadata = (node->mMetaData != NULL ? node->mMetaData->mNumProperties : 0);

        Write<aiString>(&chunk,node->mName);
        Write<aiMatrix4x4>(&chunk,node->mTransformation);
        Write<unsigned int>(&chunk,node->mNumChildren);
        Write<unsigned int>(&chunk,node->mNumMeshes);
        Write<unsigned int>(&chunk,nb_metadata);

        for (unsigned int i = 0; i < node->mNumMeshes;++i) {
            Write<unsigned int>(&chunk,node->mMeshes[i]);
        }

        for (unsigned int i = 0; i < node->mNumChildren;++i) {
            WriteBinaryNode( &chunk, node->mChildren[i] );
        }

        for (unsigned int i = 0; i < nb_metadata; ++i) {
            const aiString& key = node->mMetaData->mKeys[i];
            aiMetadataType type = node->mMetaData->mValues[i].mType;
            void* value = node->mMetaData->mValues[i].mData;

            Write<aiString>(&chunk, key);
            Write<uint16_t>(&chunk, type);

            switch (type) {
                case AI_BOOL:
                    Write<bool>(&chunk, *((bool*) value));
                    break;
                case AI_INT32:
                    Write<int32_t>(&chunk, *((int32_t*) value));
                    break;
                case AI_UINT64:
                    Write<uint64_t>(&chunk, *((uint64_t*) value));
                    break;
                case AI_FLOAT:
                    Write<float>(&chunk, *((float*) value));
                    break;
                case AI_DOUBLE:
                    Write<double>(&chunk, *((double*) value));
                    break;
                case AI_AISTRING:
                    Write<aiString>(&chunk, *((aiString*) value));
                    break;
                case AI_AIVECTOR3D:
                    Write<aiVector3D>(&chunk, *((aiVector3D*) value));
                    break;
#ifdef SWIG
                case FORCE_32BIT:
#endif // SWIG
                default:
                    break;
            }
        }
    }